

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

double Catch::Benchmark::Detail::normal_quantile(double p)

{
  int iVar1;
  double dVar2;
  double result;
  double p_local;
  
  if ((normal_quantile(double)::ROOT_TWO == '\0') &&
     (iVar1 = __cxa_guard_acquire(&normal_quantile(double)::ROOT_TWO), iVar1 != 0)) {
    normal_quantile::ROOT_TWO = sqrt(2.0);
    __cxa_guard_release(&normal_quantile(double)::ROOT_TWO);
  }
  if (p < 0.0 || 1.0 < p) {
    __assert_fail("p >= 0 && p <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/catch2/catch.hpp"
                  ,0x1e5e,"double Catch::Benchmark::Detail::normal_quantile(double)");
  }
  if ((p < 0.0) || (1.0 < p)) {
    p_local = 0.0;
  }
  else {
    dVar2 = erfc_inv(p * 2.0);
    p_local = normal_quantile::ROOT_TWO * -dVar2;
  }
  return p_local;
}

Assistant:

double normal_quantile(double p) {
                static const double ROOT_TWO = std::sqrt(2.0);

                double result = 0.0;
                assert(p >= 0 && p <= 1);
                if (p < 0 || p > 1) {
                    return result;
                }

                result = -erfc_inv(2.0 * p);
                // result *= normal distribution standard deviation (1.0) * sqrt(2)
                result *= /*sd * */ ROOT_TWO;
                // result += normal disttribution mean (0)
                return result;
            }